

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.h
# Opt level: O1

void __thiscall
spvtools::val::ValidationState_t::RegisterEntryPoint
          (ValidationState_t *this,uint32_t id,ExecutionModel execution_model,
          EntryPointDescription *desc)

{
  iterator __position;
  _Rb_tree<spv::ExecutionModel,spv::ExecutionModel,std::_Identity<spv::ExecutionModel>,std::less<spv::ExecutionModel>,std::allocator<spv::ExecutionModel>>
  *this_00;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>>
  *this_01;
  uint32_t local_20;
  ExecutionModel local_1c;
  
  __position._M_current =
       (this->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_20 = id;
  local_1c = execution_model;
  if (__position._M_current ==
      (this->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->entry_points_,__position,
               &local_20);
  }
  else {
    *__position._M_current = id;
    (this->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  this_00 = (_Rb_tree<spv::ExecutionModel,spv::ExecutionModel,std::_Identity<spv::ExecutionModel>,std::less<spv::ExecutionModel>,std::allocator<spv::ExecutionModel>>
             *)std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->entry_point_to_execution_models_,&local_20);
  std::
  _Rb_tree<spv::ExecutionModel,spv::ExecutionModel,std::_Identity<spv::ExecutionModel>,std::less<spv::ExecutionModel>,std::allocator<spv::ExecutionModel>>
  ::_M_insert_unique<spv::ExecutionModel_const&>(this_00,&local_1c);
  this_01 = (vector<spvtools::val::ValidationState_t::EntryPointDescription,std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>>
             *)std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->entry_point_descriptions_,&local_20);
  std::
  vector<spvtools::val::ValidationState_t::EntryPointDescription,std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>>
  ::emplace_back<spvtools::val::ValidationState_t::EntryPointDescription&>(this_01,desc);
  return;
}

Assistant:

void RegisterEntryPoint(const uint32_t id,
                          spv::ExecutionModel execution_model,
                          EntryPointDescription&& desc) {
    entry_points_.push_back(id);
    entry_point_to_execution_models_[id].insert(execution_model);
    entry_point_descriptions_[id].emplace_back(desc);
  }